

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::_InternalParse
          (GeneratedCodeInfo_Annotation *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte *pbVar2;
  uint64 uVar3;
  byte *pbVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  Arena *arena;
  string *s;
  uint uVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  pair<const_char_*,_bool> pVar11;
  byte *local_40;
  InternalMetadataWithArena *local_38;
  
  local_38 = &this->_internal_metadata_;
  this_00 = &this->source_file_;
  uVar8 = 0;
  local_40 = (byte *)ptr;
LAB_0022017a:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= local_40) {
      if ((long)local_40 - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_002203b0;
      pVar11 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,(char *)local_40,ctx->group_depth_);
      local_40 = (byte *)pVar11.first;
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_002203b0;
    }
    bVar1 = *local_40;
    uVar7 = (ulong)bVar1;
    pbVar4 = local_40 + 1;
    if ((char)bVar1 < '\0') {
      uVar6 = ((uint)bVar1 + (uint)*pbVar4 * 0x80) - 0x80;
      uVar7 = (ulong)uVar6;
      if (-1 < (char)*pbVar4) {
        pbVar4 = local_40 + 2;
        goto LAB_002201aa;
      }
      pVar9 = internal::ReadTagFallback((char *)local_40,uVar6);
      local_40 = (byte *)pVar9.first;
      if (local_40 == (byte *)0x0) goto LAB_002203c3;
    }
    else {
LAB_002201aa:
      pVar9._8_8_ = uVar7;
      pVar9.first = (char *)pbVar4;
      local_40 = pbVar4;
    }
    pbVar4 = (byte *)pVar9.first;
    uVar6 = pVar9.second;
    cVar5 = (char)pVar9.second;
    switch((uint)(pVar9._8_8_ >> 3) & 0x1fffffff) {
    case 1:
      if (cVar5 == '\n') {
        local_40 = (byte *)internal::PackedInt32Parser(&this->path_,(char *)pbVar4,ctx);
      }
      else {
        if ((uVar6 & 0xff) != 8) break;
        uVar3 = internal::ReadVarint((char **)&local_40);
        _internal_add_path(this,(int32)uVar3);
      }
      goto joined_r0x00220395;
    case 2:
      if (cVar5 != '\x12') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      arena = (Arena *)(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      s = this_00->ptr_;
      if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_00,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        s = this_00->ptr_;
        pbVar4 = local_40;
      }
      local_40 = (byte *)internal::InlineGreedyStringParser(s,(char *)pbVar4,ctx);
      goto joined_r0x00220395;
    case 3:
      if (cVar5 == '\x18') {
        uVar8 = uVar8 | 2;
        bVar1 = *pbVar4;
        uVar6 = (uint)bVar1;
        pbVar2 = pbVar4 + 1;
        if ((char)bVar1 < '\0') {
          uVar6 = ((uint)bVar1 + (uint)*pbVar2 * 0x80) - 0x80;
          if ((char)*pbVar2 < '\0') {
            pVar10 = internal::VarintParseSlow64((char *)pbVar4,uVar6);
            local_40 = (byte *)pVar10.first;
            this->begin_ = (int32)pVar10.second;
            goto joined_r0x00220395;
          }
          pbVar2 = pbVar4 + 2;
        }
        this->begin_ = uVar6;
        local_40 = pbVar2;
        goto LAB_0022017a;
      }
      break;
    case 4:
      if (cVar5 == ' ') {
        uVar8 = uVar8 | 4;
        bVar1 = *pbVar4;
        uVar6 = (uint)bVar1;
        pbVar2 = pbVar4 + 1;
        if ((char)bVar1 < '\0') {
          uVar6 = ((uint)bVar1 + (uint)*pbVar2 * 0x80) - 0x80;
          if ((char)*pbVar2 < '\0') {
            pVar10 = internal::VarintParseSlow64((char *)pbVar4,uVar6);
            local_40 = (byte *)pVar10.first;
            this->end_ = (int32)pVar10.second;
            goto joined_r0x00220395;
          }
          pbVar2 = pbVar4 + 2;
        }
        this->end_ = uVar6;
        local_40 = pbVar2;
        goto LAB_0022017a;
      }
    }
    if ((uVar6 == 0) || ((uVar6 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar6 - 1;
      local_40 = pbVar4;
      goto LAB_002203b0;
    }
    local_40 = (byte *)internal::UnknownFieldParse(uVar6,local_38,(char *)pbVar4,ctx);
joined_r0x00220395:
    if (local_40 == (byte *)0x0) {
LAB_002203c3:
      local_40 = (byte *)0x0;
LAB_002203b0:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar8;
      return (char *)local_40;
    }
  } while( true );
}

Assistant:

const char* GeneratedCodeInfo_Annotation::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated int32 path = 1 [packed = true];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_path(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8) {
          _internal_add_path(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string source_file = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_source_file(), ptr, ctx, "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 begin = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_begin(&has_bits);
          begin_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}